

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool PIT_FindFloorCeiling
               (FMultiBlockLinesIterator *mit,CheckResult *cres,FBoundingBox *box,
               FCheckPosition *tmf,int flags)

{
  line_t *ld;
  bool bVar1;
  uint uVar2;
  AActor *extraout_RAX;
  double dVar4;
  FLineOpening open;
  DVector2 refpoint;
  FLineOpening local_d8;
  DVector2 local_40;
  AActor *pAVar3;
  
  ld = cres->line;
  bVar1 = FBoundingBox::inRange(box,ld);
  pAVar3 = (AActor *)(ulong)bVar1;
  if (bVar1) {
    uVar2 = FBoundingBox::BoxOnLineSide(box,ld);
    pAVar3 = (AActor *)(ulong)uVar2;
    if (uVar2 == 0xffffffff) {
      if (ffcf_verbose == true) {
        uVar2 = Printf("Hit line %d at position %f,%f, group %d\n",(cres->Position).X,
                       (cres->Position).Y,((long)ld - (long)lines) / 0x98 & 0xffffffff,
                       (ulong)(uint)ld->frontsector->PortalGroup);
        pAVar3 = (AActor *)(ulong)uVar2;
      }
      if (ld->backsector != (sector_t *)0x0) {
        local_d8.top = (cres->Position).X;
        local_d8.bottom = (cres->Position).Y;
        FindRefPoint(ld,(DVector2 *)&local_d8);
        P_LineOpening(&local_d8,tmf->thing,ld,&local_40,(DVector2 *)&cres->Position,flags);
        pAVar3 = extraout_RAX;
        if (((flags & 0x40U) == 0) && (pAVar3 = extraout_RAX, local_d8.top < tmf->ceilingz)) {
          tmf->ceilingz = local_d8.top;
          if ((AActor *)local_d8.topsec != (AActor *)0x0) {
            tmf->ceilingsector = local_d8.topsec;
          }
          if (ffcf_verbose == true) {
            uVar2 = Printf("    Adjust ceilingz to %f\n");
            local_d8.topsec = (sector_t *)(ulong)uVar2;
          }
          mit->continueup = false;
          pAVar3 = (AActor *)local_d8.topsec;
        }
        if ((flags & 0x20U) == 0) {
          dVar4 = tmf->floorz;
          if (local_d8.bottom <= dVar4) {
            if ((local_d8.bottom == dVar4) && (!NAN(local_d8.bottom) && !NAN(dVar4))) {
              tmf->touchmidtex = (bool)(tmf->touchmidtex | local_d8.touchmidtex);
              pAVar3 = (AActor *)(ulong)local_d8.abovemidtex;
              tmf->abovemidtex = (bool)(tmf->abovemidtex | local_d8.abovemidtex);
            }
          }
          else {
            tmf->floorz = local_d8.bottom;
            if (local_d8.bottomsec != (sector_t *)0x0) {
              tmf->floorsector = local_d8.bottomsec;
            }
            tmf->touchmidtex = local_d8.touchmidtex;
            tmf->abovemidtex = local_d8.abovemidtex;
            dVar4 = local_d8.bottom;
            if (ffcf_verbose == true) {
              Printf("    Adjust floorz to %f\n");
              dVar4 = tmf->floorz;
            }
            pAVar3 = tmf->thing;
            if (tmf->dropoffz + *(double *)(pAVar3->args + 0x50) < dVar4) {
              mit->continuedown = false;
            }
          }
          if ((-3.4028234663852886e+38 < local_d8.lowfloor) && (local_d8.lowfloor < tmf->dropoffz))
          {
            tmf->dropoffz = local_d8.lowfloor;
            if (ffcf_verbose == true) {
              Printf("    Adjust dropoffz to %f\n",local_d8.bottom);
              dVar4 = tmf->floorz;
              local_d8.lowfloor = tmf->dropoffz;
            }
            pAVar3 = tmf->thing;
            if (local_d8.lowfloor + *(double *)(pAVar3->args + 0x50) < dVar4) {
              mit->continuedown = false;
            }
          }
        }
      }
    }
  }
  return SUB81(pAVar3,0);
}

Assistant:

static bool PIT_FindFloorCeiling(FMultiBlockLinesIterator &mit, FMultiBlockLinesIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tmf, int flags)
{
	line_t *ld = cres.line;

	if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
		return true;

	// A line has been hit

	if (ffcf_verbose)
	{
		Printf("Hit line %d at position %f,%f, group %d\n",
			int(ld - lines), cres.Position.X, cres.Position.Y, ld->frontsector->PortalGroup);
	}

	if (!ld->backsector)
	{ // One sided line
		return true;
	}

	DVector2 refpoint = FindRefPoint(ld, cres.Position);
	FLineOpening open;

	P_LineOpening(open, tmf.thing, ld, refpoint, &cres.Position, flags);

	// adjust floor / ceiling heights
	if (!(flags & FFCF_NOCEILING))
	{
		if (open.top < tmf.ceilingz)
		{
			tmf.ceilingz = open.top;
			if (open.topsec != NULL) tmf.ceilingsector = open.topsec;
			if (ffcf_verbose) Printf("    Adjust ceilingz to %f\n", open.top);
			mit.StopUp();
		}
	}

	if (!(flags & FFCF_NOFLOOR))
	{
		if (open.bottom > tmf.floorz)
		{
			tmf.floorz = open.bottom;
			if (open.bottomsec != NULL) tmf.floorsector = open.bottomsec;
			tmf.touchmidtex = open.touchmidtex;
			tmf.abovemidtex = open.abovemidtex;
			if (ffcf_verbose) Printf("    Adjust floorz to %f\n", open.bottom);
			if (tmf.floorz > tmf.dropoffz + tmf.thing->MaxDropOffHeight) mit.StopDown();
		}
		else if (open.bottom == tmf.floorz)
		{
			tmf.touchmidtex |= open.touchmidtex;
			tmf.abovemidtex |= open.abovemidtex;
		}

		if (open.lowfloor < tmf.dropoffz && open.lowfloor > LINEOPEN_MIN)
		{
			tmf.dropoffz = open.lowfloor;
			if (ffcf_verbose) Printf("    Adjust dropoffz to %f\n", open.bottom);
			if (tmf.floorz > tmf.dropoffz + tmf.thing->MaxDropOffHeight) mit.StopDown();
		}
	}
	return true;
}